

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_definitions_section.cpp
# Opt level: O0

ssize_t __thiscall
pstore::repo::linked_definitions_creation_dispatcher::write
          (linked_definitions_creation_dispatcher *this,int __fd,void *__buf,size_t __n)

{
  linked_definitions *plVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  linked_definitions *this_00;
  linked_definitions *dependent;
  uint8_t *out_local;
  linked_definitions_creation_dispatcher *this_local;
  
  this_00 = (linked_definitions *)CONCAT44(in_register_00000034,__fd);
  plVar1 = (linked_definitions *)
           section_creation_dispatcher::aligned
                     (&this->super_section_creation_dispatcher,(uint8_t *)this_00);
  if (plVar1 == this_00) {
    linked_definitions::linked_definitions<pstore::repo::linked_definitions::value_type_const*,void>
              (this_00,this->begin_,this->end_);
    sVar2 = linked_definitions::size_bytes(this_00);
    return (long)this_00->definitions_ + (sVar2 - 0x10);
  }
  assert_failed("this->aligned (out) == out",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/linked_definitions_section.cpp"
                ,0x60);
}

Assistant:

std::uint8_t *
        linked_definitions_creation_dispatcher::write (std::uint8_t * const out) const {
            PSTORE_ASSERT (this->aligned (out) == out);
            auto * const dependent = new (out) linked_definitions (begin_, end_);
            return out + dependent->size_bytes ();
        }